

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O0

int ConnectIM483I(IM483I *pIM483I,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  uint8 local_538 [4];
  int recvbuflen;
  char recvbuf [512];
  uint8 local_328 [4];
  int sendbuflen;
  char sendbuf [512];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  IM483I *pIM483I_local;
  
  memset(pIM483I->szCfgFilePath,0,0x100);
  sprintf(pIM483I->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(sendbuf + 0x1f8,0,0x100);
    memset(pIM483I->szDevPath,0,0x100);
    sprintf(pIM483I->szDevPath,"COM1");
    pIM483I->BaudRate = 0x12c0;
    pIM483I->timeout = 1000;
    pIM483I->threadperiod = 0x32;
    pIM483I->bSaveRawData = 1;
    pIM483I->bytedelayus = -1;
    pIM483I->bCheckState = 0;
    pIM483I->CalibrationSpeed = 2000;
    pIM483I->CalibrationTime = 65000;
    pIM483I->CalibrationHoldTorque = 1;
    pIM483I->CalibrationRunTorque = 0x3c;
    pIM483I->NormalHoldTorque = 1;
    pIM483I->NormalRunTorque = 100;
    pIM483I->ThresholdRval = 0;
    pIM483I->MinAngle = 0.0;
    pIM483I->MaxAngle = 1.5707963267948966;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%255s",pIM483I->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->bytedelayus);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->bCheckState);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->CalibrationSpeed);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->CalibrationTime);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->CalibrationHoldTorque);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->CalibrationRunTorque);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->NormalHoldTorque);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->NormalRunTorque);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%d",&pIM483I->ThresholdRval);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%lf",&pIM483I->MinAngle);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1f8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1f8,"%lf",&pIM483I->MaxAngle);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose(__stream);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pIM483I->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pIM483I->threadperiod = 0x32;
  }
  iVar1 = pIM483I->CalibrationSpeed;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (0x13 < iVar1) {
    iVar1 = pIM483I->CalibrationSpeed;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 < 0x4e21) goto LAB_001207ed;
  }
  printf("Invalid parameter : CalibrationSpeed.\n");
  pIM483I->CalibrationSpeed = 2000;
LAB_001207ed:
  if ((pIM483I->CalibrationTime < 0) || (600000 < pIM483I->CalibrationTime)) {
    printf("Invalid parameter : CalibrationTime.\n");
    pIM483I->CalibrationTime = 65000;
  }
  if ((pIM483I->CalibrationHoldTorque < 0) || (100 < pIM483I->CalibrationHoldTorque)) {
    printf("Invalid parameter : CalibrationHoldTorque.\n");
    pIM483I->CalibrationHoldTorque = 1;
  }
  if ((pIM483I->CalibrationRunTorque < 0) || (100 < pIM483I->CalibrationRunTorque)) {
    printf("Invalid parameter : CalibrationRunTorque.\n");
    pIM483I->CalibrationRunTorque = 0x3c;
  }
  if ((pIM483I->NormalHoldTorque < 0) || (100 < pIM483I->NormalHoldTorque)) {
    printf("Invalid parameter : NormalHoldTorque.\n");
    pIM483I->NormalHoldTorque = 1;
  }
  if ((pIM483I->NormalRunTorque < 0) || (100 < pIM483I->NormalRunTorque)) {
    printf("Invalid parameter : NormalRunTorque.\n");
    pIM483I->NormalRunTorque = 100;
  }
  pIM483I->LastRval = 0x2000004;
  iVar1 = OpenRS232Port(&pIM483I->RS232Port,pIM483I->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pIM483I->RS232Port,pIM483I->BaudRate,'\0',0,'\b','\0',
                                pIM483I->timeout);
    if (iVar1 == 0) {
      memset(local_328,0,0x200);
      sprintf((char *)local_328," \r");
      sVar3 = strlen((char *)local_328);
      iVar1 = WriteDataIM483I(pIM483I,local_328,(int)sVar3,pIM483I->bytedelayus);
      if (iVar1 == 0) {
        if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
          fwrite(local_328,(long)(int)sVar3,1,(FILE *)pIM483I->pfSaveFile);
          fflush((FILE *)pIM483I->pfSaveFile);
        }
        mSleep(100);
        if (pIM483I->bCheckState != 0) {
          memset(local_538,0,0x200);
          iVar1 = ReadUntilRS232Port(&pIM483I->RS232Port,local_538,'#',0x1ff);
          if (iVar1 != 0) {
            printf("Unable to connect to a IM483I.\n");
            CloseRS232Port(&pIM483I->RS232Port);
            return 1;
          }
          if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
            fwrite(local_538,0x1ff,1,(FILE *)pIM483I->pfSaveFile);
            fflush((FILE *)pIM483I->pfSaveFile);
          }
        }
        printf("IM483I connected.\n");
        pIM483I_local._4_4_ = 0;
      }
      else {
        printf("Unable to connect to a IM483I.\n");
        CloseRS232Port(&pIM483I->RS232Port);
        pIM483I_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a IM483I.\n");
      CloseRS232Port(&pIM483I->RS232Port);
      pIM483I_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a IM483I.\n");
    pIM483I_local._4_4_ = 1;
  }
  return pIM483I_local._4_4_;
}

Assistant:

inline int ConnectIM483I(IM483I* pIM483I, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	memset(pIM483I->szCfgFilePath, 0, sizeof(pIM483I->szCfgFilePath));
	sprintf(pIM483I->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pIM483I->szDevPath, 0, sizeof(pIM483I->szDevPath));
		sprintf(pIM483I->szDevPath, "COM1");
		pIM483I->BaudRate = 4800;
		pIM483I->timeout = 1000;
		pIM483I->threadperiod = 50;
		pIM483I->bSaveRawData = 1;
		pIM483I->bytedelayus = -1;
		pIM483I->bCheckState = 0;
		pIM483I->CalibrationSpeed = CALIBRATION_SPEED_IM483I;
		pIM483I->CalibrationTime = CALIBRATION_TIME_IM483I;
		pIM483I->CalibrationHoldTorque = CALIBRATION_HOLD_TORQUE_IM483I;
		pIM483I->CalibrationRunTorque = CALIBRATION_RUN_TORQUE_IM483I;
		pIM483I->NormalHoldTorque = NORMAL_HOLD_TORQUE_IM483I;
		pIM483I->NormalRunTorque = NORMAL_RUN_TORQUE_IM483I;
		pIM483I->ThresholdRval = 0;
		pIM483I->MinAngle = MIN_ANGLE_IM483I;
		pIM483I->MaxAngle = MAX_ANGLE_IM483I;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pIM483I->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bytedelayus) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bCheckState) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationSpeed) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationTime) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationHoldTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationRunTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->NormalHoldTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->NormalRunTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->ThresholdRval) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pIM483I->MinAngle) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pIM483I->MaxAngle) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pIM483I->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pIM483I->threadperiod = 50;
	}
	if ((abs(pIM483I->CalibrationSpeed) < MIN_MOTOR_SPEED_IM483I)||(abs(pIM483I->CalibrationSpeed) > MAX_MOTOR_SPEED_IM483I))
	{
		printf("Invalid parameter : CalibrationSpeed.\n");
		pIM483I->CalibrationSpeed = CALIBRATION_SPEED_IM483I;
	}
	if ((pIM483I->CalibrationTime < 0)||(pIM483I->CalibrationTime > MAX_CALIBRATION_TIME_IM483I))
	{
		printf("Invalid parameter : CalibrationTime.\n");
		pIM483I->CalibrationTime = CALIBRATION_TIME_IM483I;
	}
	if ((pIM483I->CalibrationHoldTorque < 0)||(pIM483I->CalibrationHoldTorque > 100))
	{
		printf("Invalid parameter : CalibrationHoldTorque.\n");
		pIM483I->CalibrationHoldTorque = CALIBRATION_HOLD_TORQUE_IM483I;
	}
	if ((pIM483I->CalibrationRunTorque < 0)||(pIM483I->CalibrationRunTorque > 100))
	{
		printf("Invalid parameter : CalibrationRunTorque.\n");
		pIM483I->CalibrationRunTorque = CALIBRATION_RUN_TORQUE_IM483I;
	}
	if ((pIM483I->NormalHoldTorque < 0)||(pIM483I->NormalHoldTorque > 100))
	{
		printf("Invalid parameter : NormalHoldTorque.\n");
		pIM483I->NormalHoldTorque = NORMAL_HOLD_TORQUE_IM483I;
	}
	if ((pIM483I->NormalRunTorque < 0)||(pIM483I->NormalRunTorque > 100))
	{
		printf("Invalid parameter : NormalRunTorque.\n");
		pIM483I->NormalRunTorque = NORMAL_RUN_TORQUE_IM483I;
	}

	// Used to save raw data, should be handled specifically...
	//pIM483I->pfSaveFile = NULL;

	pIM483I->LastRval = 4*((int)MAX_INDEX_IM483I+2);

	if (OpenRS232Port(&pIM483I->RS232Port, pIM483I->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pIM483I->RS232Port, pIM483I->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pIM483I->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		CloseRS232Port(&pIM483I->RS232Port);
		return EXIT_FAILURE;
	}

	// Initialization.
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, " \r");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		CloseRS232Port(&pIM483I->RS232Port);
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(100);

	if (pIM483I->bCheckState)
	{
		// Should reply 
		// "xxxx xxxx ADVANCED MICRO SYSTEMS, INC\r\nMAX-2000 vX.XXi\r\n#"...
		// e.g.
		// "     4038 ADVANCED MICRO SYSTEMS, INC\r\nMAX-2000 v1.15i\r\n#"...
		// If already initialized
		// " #"?

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sizeof(recvbuf)-1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadUntilRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, '#', recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a IM483I.\n");
			CloseRS232Port(&pIM483I->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
	}

	printf("IM483I connected.\n");

	return EXIT_SUCCESS;
}